

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_wrt.c
# Opt level: O0

_Bool tool_create_output_file(OutStruct *outs)

{
  GlobalConfig *config;
  char *pcVar1;
  FILE *pFVar2;
  char *pcVar3;
  int *piVar4;
  FILE *file;
  GlobalConfig *global;
  OutStruct *outs_local;
  
  config = outs->config->global;
  if ((outs->filename == (char *)0x0) || (*outs->filename == '\0')) {
    warnf(config,"Remote filename has no length!\n");
    outs_local._7_1_ = false;
  }
  else if (((outs->is_cd_filename & 1U) == 0) ||
          (pFVar2 = fopen64(outs->filename,"rb"), pFVar2 == (FILE *)0x0)) {
    pFVar2 = fopen64(outs->filename,"wb");
    if (pFVar2 == (FILE *)0x0) {
      pcVar1 = outs->filename;
      piVar4 = __errno_location();
      pcVar3 = strerror(*piVar4);
      warnf(config,"Failed to create the file %s: %s\n",pcVar1,pcVar3);
      outs_local._7_1_ = false;
    }
    else {
      outs->s_isreg = true;
      outs->fopened = true;
      outs->stream = (FILE *)pFVar2;
      outs->bytes = 0;
      outs->init = 0;
      outs_local._7_1_ = true;
    }
  }
  else {
    fclose(pFVar2);
    pcVar1 = outs->filename;
    pcVar3 = strerror(0x11);
    warnf(config,"Refusing to overwrite %s: %s\n",pcVar1,pcVar3);
    outs_local._7_1_ = false;
  }
  return outs_local._7_1_;
}

Assistant:

bool tool_create_output_file(struct OutStruct *outs)
{
  struct GlobalConfig *global = outs->config->global;
  FILE *file;

  if(!outs->filename || !*outs->filename) {
    warnf(global, "Remote filename has no length!\n");
    return FALSE;
  }

  if(outs->is_cd_filename) {
    /* don't overwrite existing files */
    file = fopen(outs->filename, "rb");
    if(file) {
      fclose(file);
      warnf(global, "Refusing to overwrite %s: %s\n", outs->filename,
            strerror(EEXIST));
      return FALSE;
    }
  }

  /* open file for writing */
  file = fopen(outs->filename, "wb");
  if(!file) {
    warnf(global, "Failed to create the file %s: %s\n", outs->filename,
          strerror(errno));
    return FALSE;
  }
  outs->s_isreg = TRUE;
  outs->fopened = TRUE;
  outs->stream = file;
  outs->bytes = 0;
  outs->init = 0;
  return TRUE;
}